

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O0

int __thiscall Activation::remove(Activation *this,char *__filename)

{
  size_type sVar1;
  iterator iVar2;
  __normal_iterator<Func_Param_*,_std::vector<Func_Param,_std::allocator<Func_Param>_>_> local_30;
  __normal_iterator<Func_Param_*,_std::vector<Func_Param,_std::allocator<Func_Param>_>_> local_28;
  const_iterator local_20;
  uint local_14;
  Activation *pAStack_10;
  uint index_local;
  Activation *this_local;
  
  local_14 = (uint)__filename;
  pAStack_10 = this;
  sVar1 = std::vector<Func_Param,_std::allocator<Func_Param>_>::size(&this->m_params);
  if (sVar1 <= ((ulong)__filename & 0xffffffff)) {
    std::operator<<((ostream *)&std::cout,"ERROR [activation removal]: Index out of bounds!\n");
    exit(1);
  }
  local_30._M_current =
       (Func_Param *)std::vector<Func_Param,_std::allocator<Func_Param>_>::begin(&this->m_params);
  local_28 = __gnu_cxx::
             __normal_iterator<Func_Param_*,_std::vector<Func_Param,_std::allocator<Func_Param>_>_>
             ::operator+(&local_30,(ulong)local_14);
  __gnu_cxx::__normal_iterator<Func_Param_const*,std::vector<Func_Param,std::allocator<Func_Param>>>
  ::__normal_iterator<Func_Param*>
            ((__normal_iterator<Func_Param_const*,std::vector<Func_Param,std::allocator<Func_Param>>>
              *)&local_20,&local_28);
  iVar2 = std::vector<Func_Param,_std::allocator<Func_Param>_>::erase(&this->m_params,local_20);
  return (int)iVar2._M_current;
}

Assistant:

void Activation::remove(unsigned index){
    if(index>=m_params.size()){
        std::cout<<"ERROR [activation removal]: Index out of bounds!\n";
        exit(1);
    }

    m_params.erase(m_params.begin()+index);
}